

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

NULLCRef * NULLCVector::VectorIndex(NULLCRef *__return_storage_ptr__,vector *vec,uint index)

{
  uint uVar1;
  char *pcVar2;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (index < vec->size) {
    uVar1 = vec->elemType;
    if (vec->flags != 0) {
      uVar1 = nullcGetSubType(0);
    }
    __return_storage_ptr__->typeID = uVar1;
    pcVar2 = (vec->data).ptr;
    if (vec->flags == 0) {
      pcVar2 = pcVar2 + index * vec->elemSize;
    }
    else {
      pcVar2 = *(char **)(pcVar2 + (ulong)index * 8);
    }
    __return_storage_ptr__->ptr = pcVar2;
  }
  else {
    nullcThrowError("operator[] array index out of bounds");
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorIndex(vector* vec, unsigned int index)
	{
		NULLCRef ret = { 0, 0 };
		if(index >= vec->size)
		{
			nullcThrowError("operator[] array index out of bounds");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[index] : (vec->data.ptr + vec->elemSize * index);
		return ret;
	}